

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O0

int pztopology::TPZTetrahedron::ContainedSideLocId(int side,int node)

{
  ostream *poVar1;
  int in_ESI;
  int in_EDI;
  int s_2;
  int s_1;
  int s;
  
  if ((in_EDI < 0) || (0xf < in_EDI)) {
    return -1;
  }
  if (in_EDI < 4) {
    if (in_ESI == 0) {
      return in_EDI;
    }
  }
  else {
    if (in_EDI < 7) {
      if (in_ESI == 0) {
        return in_EDI + -4;
      }
      if (in_ESI == 1) {
        return (in_EDI + -3) % 3;
      }
    }
    else {
      if (9 < in_EDI) {
        if (in_EDI < 0xe) {
          if (in_ESI < 7) {
            return *(int *)(FaceConnectLocId + (long)in_ESI * 4 + (long)(in_EDI + -10) * 0x1c);
          }
        }
        else if ((in_EDI == 0xe) && (in_ESI < 0xf)) {
          return in_ESI;
        }
        goto LAB_0159ac6f;
      }
      if (in_ESI == 0) {
        return in_EDI + -7;
      }
      if (in_ESI == 1) {
        return 3;
      }
    }
    if (in_ESI == 2) {
      return in_EDI;
    }
  }
LAB_0159ac6f:
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "TPZShapeTetra::ContainedSideLocId called for node = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," and side = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
  std::operator<<(poVar1,"\n");
  return -1;
}

Assistant:

int TPZTetrahedron::ContainedSideLocId(int side, int node) {
		if(side<0 || side>15) return -1;
		if(side<4) {
			if(node==0) return side;
		} else
			if(side<7) {//4,5,6
				int s = side-4;//0,1,2
				if(!node) return s;//0,1,2
				if(node==1) return (s+1)%3;//1,2,0
				if(node==2) return side;//4,5,6
			} else
				if(side<10) {//7,8,9
					int s = side-7;//0,1,2
					if(!node) return s;//0,1,2
					if(node==1) return 3;//4,4,4
					if(node==2) return side;//7,8,9
				} else
					if(side<14) {//10 a 13
						int s = side-10;
						if(node<7) return FaceConnectLocId[s][node];
					} else
						if(side==14 && node<15){
							return node;
						}
		PZError << "TPZShapeTetra::ContainedSideLocId called for node = "
		<< node << " and side = " << side << "\n";
		return -1;
	}